

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomColumn::read(DomColumn *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  QStringView other;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_t __nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  DomProperty *v;
  QStringView tag;
  parameter_type in_stack_ffffffffffffff48;
  parameter_type this_00;
  DomProperty *in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff58;
  DomProperty *in_stack_ffffffffffffff68;
  parameter_type pDVar5;
  DomColumn *pDVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (parameter_type)CONCAT44(in_register_00000034,__fd);
  pDVar6 = this;
  do {
    while( true ) {
      bVar2 = QXmlStreamReader::hasError((QXmlStreamReader *)0x1b0d2a);
      if (((bVar2 ^ 0xffU) & 1) == 0) goto LAB_001b0ec3;
      iVar3 = QXmlStreamReader::readNext();
      if (iVar3 != 4) break;
      QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_ffffffffffffff68,(size_t)this);
      QStringView::QStringView<QString,_true>
                ((QStringView *)this,(QString *)CONCAT44(iVar3,in_stack_ffffffffffffff58));
      __nbytes_00 = 0;
      other.m_data = (storage_type_conflict *)pDVar6;
      other.m_size = (qsizetype)this_00;
      iVar4 = QStringView::compare((QStringView *)in_stack_ffffffffffffff48,other,CaseInsensitive);
      in_stack_ffffffffffffff58 = CONCAT13(iVar4 != 0,(int3)in_stack_ffffffffffffff58) ^ 0xff000000;
      QString::~QString((QString *)0x1b0df3);
      if ((in_stack_ffffffffffffff58 & 0x1000000) == 0) {
        pDVar5 = this_00;
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)CONCAT44(iVar3,in_stack_ffffffffffffff58),
                   (size_t)in_stack_ffffffffffffff50);
        ::operator+((QLatin1String *)in_stack_ffffffffffffff50,(QStringView *)this_00);
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QLatin1String,_const_QStringView_&> *)this_00);
        QXmlStreamReader::raiseError(&this_00->m_attr_name);
        QString::~QString((QString *)0x1b0eb8);
        in_stack_ffffffffffffff48 = this_00;
        this_00 = pDVar5;
      }
      else {
        in_stack_ffffffffffffff50 = (DomProperty *)operator_new(0x178);
        memset(in_stack_ffffffffffffff50,0,0x178);
        DomProperty::DomProperty(in_stack_ffffffffffffff50);
        in_stack_ffffffffffffff68 = in_stack_ffffffffffffff50;
        DomProperty::read(in_stack_ffffffffffffff50,(int)this_00,__buf_00,__nbytes_00);
        QList<DomProperty_*>::append((QList<DomProperty_*> *)0x1b0e51,in_stack_ffffffffffffff48);
      }
    }
  } while (iVar3 != 5);
LAB_001b0ec3:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomColumn::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"property"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_property.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}